

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module-utils.h
# Opt level: O2

DataSegment * wasm::ModuleUtils::copyDataSegment(DataSegment *segment,Module *out)

{
  bool bVar1;
  char *pcVar2;
  int iVar3;
  undefined4 extraout_var;
  DataSegment *pDVar4;
  Name name;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  _Head_base<0UL,_wasm::DataSegment_*,_false> local_38;
  unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> ret;
  
  Name::Name((Name *)local_58,"");
  Name::Name((Name *)local_48,"");
  name.super_IString.str._M_str = (char *)local_58._0_8_;
  name.super_IString.str._M_len = (size_t)&local_38;
  Builder::makeDataSegment
            (name,(Name)stack0xffffffffffffffb0,(bool)local_48[8],(Expression *)0x0,(char *)0x0,
             (Address)0xc12c44);
  pcVar2 = (segment->super_Named).name.super_IString.str._M_str;
  ((local_38._M_head_impl)->super_Named).name.super_IString.str._M_len =
       (segment->super_Named).name.super_IString.str._M_len;
  ((local_38._M_head_impl)->super_Named).name.super_IString.str._M_str = pcVar2;
  ((local_38._M_head_impl)->super_Named).hasExplicitName = (segment->super_Named).hasExplicitName;
  pcVar2 = (segment->memory).super_IString.str._M_str;
  ((local_38._M_head_impl)->memory).super_IString.str._M_len =
       (segment->memory).super_IString.str._M_len;
  ((local_38._M_head_impl)->memory).super_IString.str._M_str = pcVar2;
  bVar1 = segment->isPassive;
  (local_38._M_head_impl)->isPassive = bVar1;
  if (bVar1 == false) {
    iVar3 = ExpressionManipulator::copy((EVP_PKEY_CTX *)segment->offset,(EVP_PKEY_CTX *)out);
    (local_38._M_head_impl)->offset = (Expression *)CONCAT44(extraout_var,iVar3);
  }
  std::vector<char,_std::allocator<char>_>::operator=(&(local_38._M_head_impl)->data,&segment->data)
  ;
  pDVar4 = Module::addDataSegment
                     (out,(unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)
                          &local_38);
  std::unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_>::~unique_ptr
            ((unique_ptr<wasm::DataSegment,_std::default_delete<wasm::DataSegment>_> *)&local_38);
  return pDVar4;
}

Assistant:

inline DataSegment* copyDataSegment(const DataSegment* segment, Module& out) {
  auto ret = Builder::makeDataSegment();
  ret->name = segment->name;
  ret->hasExplicitName = segment->hasExplicitName;
  ret->memory = segment->memory;
  ret->isPassive = segment->isPassive;
  if (!segment->isPassive) {
    auto offset = ExpressionManipulator::copy(segment->offset, out);
    ret->offset = offset;
  }
  ret->data = segment->data;

  return out.addDataSegment(std::move(ret));
}